

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join.c
# Opt level: O2

int run_test_udp_multicast_join(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_udp_init(puVar2,&server);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_udp_init(puVar2,&client);
      if (iVar1 == 0) {
        iVar1 = uv_udp_bind(&server,(sockaddr *)&addr,0);
        if (iVar1 == 0) {
          iVar1 = uv_udp_set_membership(&server,"239.255.0.1",(char *)0x0,UV_JOIN_GROUP);
          if (iVar1 == 0) {
            iVar1 = uv_udp_recv_start(&server,alloc_cb,cl_recv_cb);
            if (iVar1 == 0) {
              iVar1 = do_send(&req);
              if (iVar1 == 0) {
                if (close_cb_called == 0) {
                  if (cl_recv_cb_called == 0) {
                    if (sv_send_cb_called == 0) {
                      puVar2 = uv_default_loop();
                      uv_run(puVar2,UV_RUN_DEFAULT);
                      if (cl_recv_cb_called == 2) {
                        if (sv_send_cb_called == 2) {
                          if (close_cb_called == 2) {
                            puVar2 = uv_default_loop();
                            uv_walk(puVar2,close_walk_cb,(void *)0x0);
                            uv_run(puVar2,UV_RUN_DEFAULT);
                            puVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(puVar2);
                            if (iVar1 == 0) {
                              uv_library_shutdown();
                              return 0;
                            }
                            pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                            uVar3 = 0xb3;
                          }
                          else {
                            pcVar4 = "close_cb_called == 2";
                            uVar3 = 0xb1;
                          }
                        }
                        else {
                          pcVar4 = "sv_send_cb_called == 2";
                          uVar3 = 0xb0;
                        }
                      }
                      else {
                        pcVar4 = "cl_recv_cb_called == 2";
                        uVar3 = 0xaf;
                      }
                    }
                    else {
                      pcVar4 = "sv_send_cb_called == 0";
                      uVar3 = 0xaa;
                    }
                  }
                  else {
                    pcVar4 = "cl_recv_cb_called == 0";
                    uVar3 = 0xa9;
                  }
                }
                else {
                  pcVar4 = "close_cb_called == 0";
                  uVar3 = 0xa8;
                }
              }
              else {
                pcVar4 = "r == 0";
                uVar3 = 0xa6;
              }
            }
            else {
              pcVar4 = "r == 0";
              uVar3 = 0xa3;
            }
          }
          else {
            if (iVar1 == -0x13) {
              fprintf(_stderr,"%s\n","No multicast support.");
              fflush(_stderr);
              return 1;
            }
            pcVar4 = "r == 0";
            uVar3 = 0xa0;
          }
        }
        else {
          pcVar4 = "r == 0";
          uVar3 = 0x9a;
        }
      }
      else {
        pcVar4 = "r == 0";
        uVar3 = 0x96;
      }
    }
    else {
      pcVar4 = "r == 0";
      uVar3 = 0x93;
    }
  }
  else {
    pcVar4 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uVar3 = 0x90;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-multicast-join.c"
          ,uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(udp_multicast_join) {
  int r;
  struct sockaddr_in addr;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_udp_init(uv_default_loop(), &server);
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  /* bind to the desired port */
  r = uv_udp_bind(&server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  /* join the multicast channel */
  r = uv_udp_set_membership(&server, MULTICAST_ADDR, NULL, UV_JOIN_GROUP);
  if (r == UV_ENODEV)
    RETURN_SKIP("No multicast support.");
  ASSERT(r == 0);

  r = uv_udp_recv_start(&server, alloc_cb, cl_recv_cb);
  ASSERT(r == 0);

  r = do_send(&req);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 0);
  ASSERT(cl_recv_cb_called == 0);
  ASSERT(sv_send_cb_called == 0);

  /* run the loop till all events are processed */
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(cl_recv_cb_called == 2);
  ASSERT(sv_send_cb_called == 2);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}